

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

char * lua_tolstring(lua_State *L,int idx,size_t *len)

{
  ulong local_38;
  TValue *local_30;
  StkId o;
  size_t *len_local;
  int idx_local;
  lua_State *L_local;
  
  local_30 = index2addr(L,idx);
  if ((local_30->tt_ & 0xfU) != 4) {
    if ((local_30->tt_ & 0xfU) != 3) {
      if (len != (size_t *)0x0) {
        *len = 0;
      }
      return (char *)0x0;
    }
    luaO_tostring(L,local_30);
    if (0 < L->l_G->GCdebt) {
      luaC_step(L);
    }
    local_30 = index2addr(L,idx);
  }
  if (len != (size_t *)0x0) {
    if (((local_30->value_).gc)->tt == '\x04') {
      local_38 = (ulong)(byte)(local_30->value_).f[0xb];
    }
    else {
      local_38 = *(ulong *)((local_30->value_).f + 0x10);
    }
    *len = local_38;
  }
  return (char *)((local_30->value_).f + 0x18);
}

Assistant:

LUA_API const char *lua_tolstring (lua_State *L, int idx, size_t *len) {
  StkId o = index2addr(L, idx);
  if (!ttisstring(o)) {
    if (!cvt2str(o)) {  /* not convertible? */
      if (len != NULL) *len = 0;
      return NULL;
    }
    lua_lock(L);  /* 'luaO_tostring' may create a new string */
    luaO_tostring(L, o);
    luaC_checkGC(L);
    o = index2addr(L, idx);  /* previous call may reallocate the stack */
    lua_unlock(L);
  }
  if (len != NULL)
    *len = vslen(o);
  return svalue(o);
}